

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O2

void hide_tractor_beams(Am_Object *ship_obj,bool become_visible)

{
  Am_Slot_Key AVar1;
  char cVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  ushort uVar5;
  ushort uVar6;
  Am_Object other_ship;
  Am_Object beam;
  Am_Value_List beams;
  Am_Value_List other_beams;
  
  beam.data = (Am_Object_Data *)0x0;
  other_ship.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&beams);
  Am_Value_List::Am_Value_List(&other_beams);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)ship_obj,(ulong)TB_LIST);
  Am_Value_List::operator=(&beams,pAVar3);
  Am_Value_List::Start();
  while( true ) {
    cVar2 = Am_Value_List::Last();
    if (cVar2 != '\0') break;
    pAVar3 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&beam,pAVar3);
    uVar5 = (ushort)&beam;
    pAVar3 = (Am_Value *)Am_Object::Get(uVar5,(ulong)TB_SOURCE);
    Am_Object::operator=(&other_ship,pAVar3);
    cVar2 = Am_Object::operator==(&other_ship,ship_obj);
    if (cVar2 != '\0') {
      pAVar3 = (Am_Value *)Am_Object::Get(uVar5,(ulong)TB_DEST);
      Am_Object::operator=(&other_ship,pAVar3);
    }
    uVar6 = (ushort)&other_ship;
    pAVar3 = (Am_Value *)Am_Object::Get(uVar6,(ulong)TB_LIST);
    Am_Value_List::operator=(&other_beams,pAVar3);
    if (become_visible) {
      pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&beam);
      Am_Value_List::Add(&other_beams,pAVar4,1);
    }
    else {
      Am_Value_List::Start();
      Am_Object::operator_cast_to_Am_Wrapper_(&beam);
      cVar2 = Am_Value_List::Member((Am_Wrapper *)&other_beams);
      if (cVar2 != '\0') {
        Am_Value_List::Delete(SUB81(&other_beams,0));
      }
    }
    Am_Object::Set(uVar5,true,(ulong)become_visible);
    AVar1 = TB_LIST;
    pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&other_beams);
    Am_Object::Set(uVar6,(Am_Wrapper *)(ulong)AVar1,(ulong)pAVar4);
    Am_Value_List::Next();
  }
  Am_Value_List::~Am_Value_List(&other_beams);
  Am_Value_List::~Am_Value_List(&beams);
  Am_Object::~Am_Object(&other_ship);
  Am_Object::~Am_Object(&beam);
  return;
}

Assistant:

void
hide_tractor_beams(Am_Object ship_obj, bool become_visible)
{
  Am_Object beam, other_ship;
  Am_Value_List beams, other_beams;
  beams = ship_obj.Get(TB_LIST);
  for (beams.Start(); !beams.Last(); beams.Next()) {
    beam = beams.Get();

    // Remove tractor beam from the value list of its other attached ship
    other_ship = beam.Get(TB_SOURCE);
    if (other_ship == ship_obj)
      // Oops, ship_obj was the source, we meant to get TB_DEST
      other_ship = beam.Get(TB_DEST);
    other_beams = other_ship.Get(TB_LIST);
    if (become_visible) { // then add it to other ships
      other_beams.Add(beam);
    } else { // remove it from other ship's list
      other_beams.Start();
      if (other_beams.Member(beam)) //sets the pointer to beam
        other_beams.Delete();
    }
    beam.Set(Am_VISIBLE, become_visible);
    other_ship.Set(TB_LIST, other_beams);
  }
}